

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseStringName(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr pxVar3;
  xmlChar *pxVar4;
  xmlChar *tmp;
  xmlParserCtxtPtr pxStack_b8;
  int max;
  xmlChar *buffer;
  int local_a8;
  int c;
  int l;
  int len;
  xmlChar *cur;
  xmlChar buf [105];
  xmlChar **str_local;
  xmlParserCtxtPtr ctxt_local;
  
  _l = *str;
  c = 0;
  iVar1 = xmlStringCurrentChar(ctxt,_l,&local_a8);
  iVar2 = xmlIsNameStartChar(ctxt,iVar1);
  if (iVar2 == 0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    if (local_a8 == 1) {
      buf[(long)c + -8] = (xmlChar)iVar1;
      c = c + 1;
    }
    else {
      iVar1 = xmlCopyCharMultiByte(buf + (long)c + -8,iVar1);
      c = iVar1 + c;
    }
    _l = _l + local_a8;
    buffer._4_4_ = xmlStringCurrentChar(ctxt,_l,&local_a8);
    do {
      iVar1 = xmlIsNameChar(ctxt,buffer._4_4_);
      if (iVar1 == 0) {
        if ((50000 < c) && ((ctxt->options & 0x80000U) == 0)) {
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
          return (xmlChar *)0x0;
        }
        *str = _l;
        pxVar4 = xmlStrndup((xmlChar *)&cur,c);
        return pxVar4;
      }
      if (local_a8 == 1) {
        buf[(long)c + -8] = (xmlChar)buffer._4_4_;
        c = c + 1;
      }
      else {
        iVar1 = xmlCopyCharMultiByte(buf + (long)c + -8,buffer._4_4_);
        c = iVar1 + c;
      }
      _l = _l + local_a8;
      buffer._4_4_ = xmlStringCurrentChar(ctxt,_l,&local_a8);
    } while (c < 100);
    tmp._4_4_ = c << 1;
    pxStack_b8 = (xmlParserCtxtPtr)(*xmlMallocAtomic)((long)tmp._4_4_);
    if (pxStack_b8 == (xmlParserCtxtPtr)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      memcpy(pxStack_b8,&cur,(long)c);
      while (iVar1 = xmlIsNameChar(ctxt,buffer._4_4_), iVar1 != 0) {
        pxVar3 = pxStack_b8;
        if (tmp._4_4_ < c + 10) {
          if ((50000 < c) && ((ctxt->options & 0x80000U) == 0)) {
            xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
            (*xmlFree)(pxStack_b8);
            return (xmlChar *)0x0;
          }
          tmp._4_4_ = tmp._4_4_ << 1;
          pxVar3 = (xmlParserCtxtPtr)(*xmlRealloc)(pxStack_b8,(long)tmp._4_4_);
          if (pxVar3 == (xmlParserCtxtPtr)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            (*xmlFree)(pxStack_b8);
            return (xmlChar *)0x0;
          }
        }
        pxStack_b8 = pxVar3;
        if (local_a8 == 1) {
          *(char *)((long)&pxStack_b8->sax + (long)c) = (char)buffer._4_4_;
          c = c + 1;
        }
        else {
          iVar1 = xmlCopyCharMultiByte((xmlChar *)((long)&pxStack_b8->sax + (long)c),buffer._4_4_);
          c = iVar1 + c;
        }
        _l = _l + local_a8;
        buffer._4_4_ = xmlStringCurrentChar(ctxt,_l,&local_a8);
      }
      *(undefined1 *)((long)&pxStack_b8->sax + (long)c) = 0;
      *str = _l;
      ctxt_local = pxStack_b8;
    }
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static xmlChar *
xmlParseStringName(xmlParserCtxtPtr ctxt, const xmlChar** str) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    const xmlChar *cur = *str;
    int len = 0, l;
    int c;

#ifdef DEBUG
    nbParseStringName++;
#endif

    c = CUR_SCHAR(cur, l);
    if (!xmlIsNameStartChar(ctxt, c)) {
	return(NULL);
    }

    COPY_BUF(l,buf,len,c);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (xmlIsNameChar(ctxt, c)) {
	COPY_BUF(l,buf,len,c);
	cur += l;
	c = CUR_SCHAR(cur, l);
	if (len >= XML_MAX_NAMELEN) { /* test bigentname.xml */
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = (xmlChar *) xmlMallocAtomic(max * sizeof(xmlChar));
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (len + 10 > max) {
		    xmlChar *tmp;

                    if ((len > XML_MAX_NAME_LENGTH) &&
                        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
			xmlFree(buffer);
                        return(NULL);
                    }
		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer,
			                            max * sizeof(xmlChar));
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
		}
		COPY_BUF(l,buffer,len,c);
		cur += l;
		c = CUR_SCHAR(cur, l);
	    }
	    buffer[len] = 0;
	    *str = cur;
	    return(buffer);
	}
    }
    if ((len > XML_MAX_NAME_LENGTH) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
        return(NULL);
    }
    *str = cur;
    return(xmlStrndup(buf, len));
}